

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# allreduce.h
# Opt level: O0

void __thiscall
AllReduceSockets::pass_up<char>
          (AllReduceSockets *this,char *buffer,size_t left_read_pos,size_t right_read_pos,
          size_t *parent_sent_pos)

{
  unsigned_long *puVar1;
  ssize_t sVar2;
  ostream *poVar3;
  vw_exception *this_00;
  ostream *poVar4;
  string *pmessage;
  undefined8 uVar5;
  ulong in_RCX;
  ulong in_RDX;
  long in_RSI;
  long in_RDI;
  ulong *in_R8;
  stringstream __msg;
  int write_size;
  size_t my_bufsize;
  int plineNumber;
  stringstream local_1c8 [16];
  ostream local_1b8;
  int local_3c;
  unsigned_long local_38;
  unsigned_long local_30;
  ulong *local_28;
  ulong local_20;
  ulong local_18;
  long local_10;
  
  local_28 = in_R8;
  local_20 = in_RCX;
  local_18 = in_RDX;
  local_10 = in_RSI;
  puVar1 = std::min<unsigned_long>(&local_18,&local_20);
  local_38 = *puVar1 - *local_28;
  puVar1 = std::min<unsigned_long>(&ar_buf_size,&local_38);
  local_30 = *puVar1;
  if (local_30 != 0) {
    sVar2 = send(*(int *)(in_RDI + 0x38),(void *)(local_10 + *local_28),(long)(int)local_30,0);
    local_3c = (int)sVar2;
    if (local_3c < 0) {
      std::__cxx11::stringstream::stringstream(local_1c8);
      poVar3 = std::operator<<(&local_1b8,"Write to parent failed ");
      poVar3 = (ostream *)std::ostream::operator<<(poVar3,local_30);
      this_00 = (vw_exception *)std::operator<<(poVar3," ");
      poVar3 = (ostream *)std::ostream::operator<<(this_00,local_3c);
      poVar4 = std::operator<<(poVar3," ");
      pmessage = (string *)std::ostream::operator<<(poVar4,*local_28);
      plineNumber = (int)((ulong)poVar4 >> 0x20);
      poVar4 = std::operator<<((ostream *)pmessage," ");
      poVar4 = (ostream *)std::ostream::operator<<(poVar4,local_18);
      poVar4 = std::operator<<(poVar4," ");
      std::ostream::operator<<(poVar4,local_20);
      uVar5 = __cxa_allocate_exception(0x38);
      std::__cxx11::stringstream::str();
      VW::vw_exception::vw_exception(this_00,(char *)poVar3,plineNumber,pmessage);
      __cxa_throw(uVar5,&VW::vw_exception::typeinfo,VW::vw_exception::~vw_exception);
    }
    *local_28 = (long)local_3c + *local_28;
  }
  return;
}

Assistant:

void pass_up(char* buffer, size_t left_read_pos, size_t right_read_pos, size_t& parent_sent_pos)
  {
    size_t my_bufsize =
        (std::min)(ar_buf_size, (std::min)(left_read_pos, right_read_pos) / sizeof(T) * sizeof(T) - parent_sent_pos);

    if (my_bufsize > 0)
    {  // going to pass up this chunk of data to the parent
      int write_size = send(socks.parent, buffer + parent_sent_pos, (int)my_bufsize, 0);
      if (write_size < 0)
        THROW("Write to parent failed " << my_bufsize << " " << write_size << " " << parent_sent_pos << " "
                                        << left_read_pos << " " << right_read_pos);

      parent_sent_pos += write_size;
    }
  }